

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
pugi::impl::(anonymous_namespace)::as_wide_impl_abi_cxx11_
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char *str,size_t size)

{
  _anonymous_namespace_ *p_Var1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbVar2;
  char *pcVar3;
  long lVar4;
  
  lVar4 = 0;
  p_Var1 = this;
  pcVar3 = str;
  if (str != (char *)0x0) {
    do {
      if ((char)*p_Var1 < '\0') {
        p_Var1 = p_Var1 + 1;
        pcVar3 = pcVar3 + -1;
      }
      else {
        lVar4 = lVar4 + 1;
        p_Var1 = p_Var1 + 1;
        pcVar3 = pcVar3 + -1;
        if (((char *)0x3 < pcVar3) && (((ulong)p_Var1 & 3) == 0)) {
          do {
            if ((*(uint *)p_Var1 & 0x80808080) != 0) break;
            lVar4 = lVar4 + 4;
            p_Var1 = p_Var1 + 4;
            pcVar3 = pcVar3 + -4;
          } while ((char *)0x3 < pcVar3);
        }
      }
    } while (pcVar3 != (char *)0x0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           std::__cxx11::wstring::resize((ulong)__return_storage_ptr__,(wchar_t)lVar4);
  if (lVar4 != 0) {
    pbVar2 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                       (this,str,(__return_storage_ptr__->_M_dataplus)._M_p);
    return pbVar2;
  }
  return pbVar2;
}

Assistant:

PUGI_IMPL_FN std::basic_string<wchar_t> as_wide_impl(const char* str, size_t size)
	{
		const uint8_t* data = reinterpret_cast<const uint8_t*>(str);

		// first pass: get length in wchar_t units
		size_t length = utf8_decoder::process(data, size, 0, wchar_counter());

		// allocate resulting string
		std::basic_string<wchar_t> result;
		result.resize(length);

		// second pass: convert to wchar_t
		if (length > 0)
		{
			wchar_writer::value_type begin = reinterpret_cast<wchar_writer::value_type>(&result[0]);
			wchar_writer::value_type end = utf8_decoder::process(data, size, begin, wchar_writer());

			assert(begin + length == end);
			(void)!end;
		}

		return result;
	}